

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall lsh::table::table(table *this,covering *c)

{
  allocator<bool> *this_00;
  uint uVar1;
  uint uVar2;
  reference this_01;
  uint uVar3;
  uint uVar4;
  reference rVar5;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_188;
  vector local_148;
  reference local_128;
  vector local_118;
  uint local_f4;
  undefined1 auStack_f0 [4];
  uint j_1;
  _Bit_type local_e8;
  uint local_e0;
  allocator<bool> local_d9;
  uint j;
  vector<bool,_std::allocator<bool>_> c_1;
  undefined1 local_a8 [8];
  vector<bool,_std::allocator<bool>_> v;
  undefined1 local_78 [4];
  uint i_1;
  uint local_54;
  undefined1 local_50 [4];
  uint i;
  vector<lsh::vector,_std::allocator<lsh::vector>_> m;
  byte local_24;
  uint n;
  uint x;
  uint r;
  uint d;
  covering *c_local;
  table *this_local;
  
  std::
  unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
  ::unordered_map(&this->vectors_);
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::vector(&this->masks_);
  std::
  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::vector(&this->partitions_);
  uVar1 = c->dimensions;
  uVar3 = c->radius + 1;
  local_24 = (byte)uVar3;
  uVar4 = 1 << (local_24 & 0x1f);
  this->dimensions_ = uVar1;
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::reserve(&this->masks_,(ulong)(uVar4 - 1));
  std::
  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::reserve(&this->partitions_,(ulong)(uVar4 - 1));
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::vector
            ((vector<lsh::vector,_std::allocator<lsh::vector>_> *)local_50);
  for (local_54 = 0; local_54 < uVar1; local_54 = local_54 + 1) {
    lsh::vector::random();
    std::vector<lsh::vector,_std::allocator<lsh::vector>_>::push_back
              ((vector<lsh::vector,_std::allocator<lsh::vector>_> *)local_50,(value_type *)local_78)
    ;
    lsh::vector::~vector((vector *)local_78);
  }
  for (v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage._4_4_ = 1;
      v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._4_4_ < uVar4;
      v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._4_4_ =
           v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    this_00 = (allocator<bool> *)
              ((long)&c_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage + 7);
    std::allocator<bool>::allocator(this_00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)uVar3,this_00);
    std::allocator<bool>::~allocator
              ((allocator<bool> *)
               ((long)&c_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 7));
    std::allocator<bool>::allocator(&local_d9);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&j,(ulong)uVar1,&local_d9);
    std::allocator<bool>::~allocator(&local_d9);
    for (local_e0 = 0; local_e0 < uVar3; local_e0 = local_e0 + 1) {
      uVar2 = v.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage._4_4_ >> ((byte)((local_24 - (char)local_e0) - 1) & 0x1f);
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_a8,(ulong)local_e0);
      _auStack_f0 = rVar5;
      std::_Bit_reference::operator=((_Bit_reference *)auStack_f0,(uVar2 & 1) != 0);
    }
    for (local_f4 = 0; local_f4 < uVar1; local_f4 = local_f4 + 1) {
      this_01 = std::vector<lsh::vector,_std::allocator<lsh::vector>_>::operator[]
                          ((vector<lsh::vector,_std::allocator<lsh::vector>_> *)local_50,
                           (ulong)local_f4);
      lsh::vector::vector(&local_118,(vector<bool,_std::allocator<bool>_> *)local_a8);
      uVar2 = lsh::vector::operator*(this_01,&local_118);
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&j,(ulong)local_f4);
      local_128 = rVar5;
      std::_Bit_reference::operator=(&local_128,(bool)((byte)uVar2 & 1));
      lsh::vector::~vector(&local_118);
    }
    lsh::vector::vector(&local_148,(vector<bool,_std::allocator<bool>_> *)&j);
    std::vector<lsh::vector,_std::allocator<lsh::vector>_>::push_back(&this->masks_,&local_148);
    lsh::vector::~vector(&local_148);
    local_188._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_188._M_h._M_rehash_policy._4_4_ = 0;
    local_188._M_h._M_rehash_policy._M_next_resize = 0;
    local_188._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_188._M_h._M_element_count = 0;
    local_188._M_h._M_buckets = (__buckets_ptr)0x0;
    local_188._M_h._M_bucket_count = 0;
    local_188._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::unordered_map(&local_188);
    std::
    vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
    ::push_back(&this->partitions_,&local_188);
    std::
    unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~unordered_map(&local_188);
    std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&j);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_a8);
  }
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::~vector
            ((vector<lsh::vector,_std::allocator<lsh::vector>_> *)local_50);
  return;
}

Assistant:

table::table(const covering& c) {
    unsigned int d = c.dimensions;
    unsigned int r = c.radius;
    unsigned int x = r + 1;
    unsigned int n = 1 << x;

    this->dimensions_ = d;
    this->masks_.reserve(n - 1);
    this->partitions_.reserve(n - 1);

    std::vector<vector> m;

    for (unsigned int i = 0; i < d; i++) {
      m.push_back(vector::random(x));
    }

    for (unsigned int i = 1; i < n; i++) {
      std::vector<bool> v(x);
      std::vector<bool> c(d);

      for (unsigned int j = 0; j < x; j++) {
        v[j] = (i >> (x - j - 1)) & 1;
      }

      for (unsigned int j = 0; j < d; j++) {
        c[j] = (m[j] * v) % 2;
      }

      this->masks_.push_back(vector(c));
      this->partitions_.push_back(partition());
    }
  }